

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  int length;
  uint op;
  size_t sVar1;
  uint c;
  int *piVar2;
  uint uVar3;
  uint pc;
  uint uVar4;
  int iVar5;
  uint a;
  int iVar6;
  double dVar7;
  
  Tps = (timeval *)malloc(0x10);
  Tpf = (timeval *)malloc(0x10);
  Tzp = (void *)0x0;
  if (0xfffffffd < argc - 4U) {
    iVar6 = 0;
    iVar5 = 0;
    if (argc != 2) {
      __s = argv[2];
      sVar1 = strlen(__s);
      length = (int)sVar1;
      iVar5 = length + 1;
      iVar6 = alloc::pos << 2;
      alloc::pos = length + alloc::pos + 1;
      copyParToMem(__s,iVar6,length);
    }
    R[1] = argc + -1;
    R[2] = 0;
    R[3] = iVar5;
    R[4] = iVar6;
    load(argv[1]);
    gettimeofday((timeval *)Tps,(__timezone_ptr_t)Tzp);
    dVar7 = 0.0;
    uVar4 = 0;
switchD_00101503_caseD_6:
    do {
      pc = uVar4;
      dVar7 = dVar7 + 1.0;
      uVar3 = C[pc];
      if (uVar3 < 0x40000000) {
        c = R[uVar3 & 0x1f];
      }
      else {
        c = ((uint)((uVar3 & 0xffff) < 0x8000) * 0x10000 + (uVar3 & 0xffff)) - 0x10000;
      }
      uVar4 = pc + 1;
      op = uVar3 >> 0x1a;
      R[0] = 0;
    } while (0x3e < op);
    a = uVar3 >> 0x15 & 0x1f;
    uVar3 = uVar3 >> 0x10 & 0x1f;
    switch(op) {
    case 0:
    case 0x10:
      R[a] = c + R[uVar3];
      goto switchD_00101503_caseD_6;
    case 1:
    case 5:
    case 0x11:
    case 0x15:
      R[a] = R[uVar3] - c;
      goto switchD_00101503_caseD_6;
    case 2:
    case 0x12:
      R[a] = c * R[uVar3];
      goto switchD_00101503_caseD_6;
    case 3:
    case 0x13:
      R[a] = R[uVar3] / (int)c;
      goto switchD_00101503_caseD_6;
    case 4:
    case 0x14:
      R[a] = R[uVar3] % (int)c;
    default:
      goto switchD_00101503_caseD_6;
    case 8:
    case 0x18:
      R[a] = c | R[uVar3];
      goto switchD_00101503_caseD_6;
    case 10:
    case 0x1a:
      c = ~c;
    case 9:
    case 0x19:
      R[a] = c & R[uVar3];
      goto switchD_00101503_caseD_6;
    case 0xb:
    case 0x1b:
      R[a] = c ^ R[uVar3];
      goto switchD_00101503_caseD_6;
    case 0xc:
    case 0x1c:
      R[a] = R[uVar3] << ((byte)c & 0x1f);
      goto switchD_00101503_caseD_6;
    case 0xe:
    case 0x1e:
      check(op,a,uVar3,c,pc);
      goto switchD_00101503_caseD_6;
    case 0x20:
      iVar5 = R[uVar3];
      piVar2 = M;
      break;
    case 0x22:
      R[a] = M[R[uVar3] / 4];
      R[uVar3] = R[uVar3] + c;
      goto switchD_00101503_caseD_6;
    case 0x24:
      M[(int)(c + R[uVar3]) / 4] = R[a];
      goto switchD_00101503_caseD_6;
    case 0x26:
      iVar5 = R[uVar3];
      R[uVar3] = iVar5 - c;
      M[(int)(iVar5 - c) / 4] = R[a];
      goto switchD_00101503_caseD_6;
    case 0x28:
      if (R[a] == 0) {
        uVar4 = c + pc;
      }
      goto switchD_00101503_caseD_6;
    case 0x29:
      if (R[a] != 0) {
        uVar4 = c + pc;
      }
      goto switchD_00101503_caseD_6;
    case 0x2a:
      if (R[a] < 0) {
        uVar4 = c + pc;
      }
      goto switchD_00101503_caseD_6;
    case 0x2b:
      if (-1 < R[a]) {
        uVar4 = c + pc;
      }
      goto switchD_00101503_caseD_6;
    case 0x2c:
      if (R[a] < 1) {
        uVar4 = c + pc;
      }
      goto switchD_00101503_caseD_6;
    case 0x2d:
      if (0 < R[a]) {
        uVar4 = c + pc;
      }
      goto switchD_00101503_caseD_6;
    case 0x2e:
      R[0x1f] = uVar4 * 4;
      uVar4 = c + pc;
      goto switchD_00101503_caseD_6;
    case 0x31:
      uVar4 = R[(int)c % 0x20] / 4;
      if ((R[(int)c % 0x20] & 0xfffffffcU) == 0x18) {
        gettimeofday((timeval *)Tpf,(__timezone_ptr_t)Tzp);
        fprintf(_stderr,"Total VM execution time (usec): %ld\n",
                ((Tpf->tv_sec - Tps->tv_sec) * 1000000 + Tpf->tv_usec) - Tps->tv_usec);
        fprintf(_stderr,"Executed instructions per second: %e\n",
                dVar7 / (double)(Tpf->tv_sec - Tps->tv_sec));
        return 0;
      }
      goto switchD_00101503_caseD_6;
    case 0x32:
      iVar5 = alloc::pos << 2;
      alloc::pos = (int)c / 4 + alloc::pos;
      R[a] = iVar5;
      goto switchD_00101503_caseD_6;
    case 0x33:
      iVar5 = R[uVar3];
      piVar2 = H;
      break;
    case 0x34:
      H[(int)(c + R[uVar3]) / 4] = R[a];
      goto switchD_00101503_caseD_6;
    case 0x35:
      R[a] = R[(int)c];
      goto switchD_00101503_caseD_6;
    case 0x37:
      putchar((int)(char)R[(int)c]);
      goto switchD_00101503_caseD_6;
    case 0x38:
      printf("%d",(ulong)(uint)R[(int)c]);
      goto switchD_00101503_caseD_6;
    case 0x39:
      iVar5 = R[uVar3];
      iVar6 = 1;
      goto LAB_00101768;
    case 0x3a:
      iVar5 = R[uVar3];
      iVar6 = 0;
LAB_00101768:
      iVar5 = getFD((int)(c + iVar5) / 4,iVar6);
LAB_001017e4:
      R[a] = iVar5;
      goto switchD_00101503_caseD_6;
    case 0x3b:
      fclose((FILE *)fds[R[(int)c]]);
      R[a] = 1;
      goto switchD_00101503_caseD_6;
    case 0x3c:
      iVar5 = feof((FILE *)fds[R[(int)c]]);
      if (iVar5 == 0) {
        R[a] = 0;
      }
      else {
        R[a] = 1;
      }
      goto switchD_00101503_caseD_6;
    case 0x3d:
      iVar5 = fgetc((FILE *)fds[R[(int)c]]);
      goto LAB_001017e4;
    case 0x3e:
      goto switchD_00101503_caseD_3e;
    }
    R[a] = piVar2[(int)(c + iVar5) / 4];
    goto switchD_00101503_caseD_6;
  }
  fwrite("usage: ./vm <vminput> <arg>\n",0x1c,1,_stderr);
LAB_001018c9:
  exit(-1);
switchD_00101503_caseD_3e:
  fprintf(_stderr,"implicit exit with code %d\n",(ulong)(uint)R[(int)c]);
  getchar();
  goto LAB_001018c9;
}

Assistant:

int main(int argc, char **argv) {
	int op = 0;
	int a = 0;
	int b = 0;
	int c = 0;
	int length = 0;
	double counter = 0;
	unsigned int pc = 0; 
	unsigned int next = 0;
	Tps = (struct timeval *) malloc(sizeof(struct timeval));
	Tpf = (struct timeval *) malloc(sizeof(struct timeval));
	Tzp = 0;


	if ((argc < 2) || (argc > 3)) {
		fprintf(stderr,"usage: ./vm <vminput> <arg>\n");
		exit(-1);
	}
	
	if (argc == 2) {
		length = 0;
		c = 0;
	} else {
		length = strlen(argv[2])+1;
		c = alloc(length);
		copyParToMem(argv[2],c,length-1);

	}
	R[1] = argc - 1; // argc
	R[2] = 0; // isOnStack
	R[3] = length; // arglength
	R[4] = c; // adr

	load(argv[1]);
	gettimeofday (Tps, Tzp);
	while (1) {
		counter = counter + 1;
		next = pc + 1;
		op = C[pc] / 0x4000000 % 0x40;
		a = C[pc] / 0x200000 % 0x20;
		b = C[pc] / 0x10000 % 0x20;
		c = C[pc] % 0x10000;
		if (op < ADDI) { 
			c = R[c % 0x20]; 
		} else if (c >= 0x8000) { 
			c = c - 0x10000; 
		}
		R[0] = 0;
		
		switch (op) {
			case ADD: case ADDI: 
				R[a] = R[b] + c; 
				break;
			case MUL: case MULI: 
				R[a] = R[b] * c; 
				break;
			case SUBI: case SUB: case CMP: case CMPI: 
				R[a] = R[b] - c; 
				break;
			case BSR: 
				next = pc + c;
				R[31] = (pc + 1) * 4;
				break;
			case PSH: 
				R[b] = R[b] - c;
				M[R[b]/4] = R[a];
				break;
			case POP: 
				R[a] = M[R[b] / 4]; 
				R[b]=R[b]+c; 
				break;
			case STW: 
				M[(R[b] + c) / 4] = R[a];	
				break;
			case LDW: 
				R[a] = M[(R[b] + c) / 4]; 
				break;
			case DIV: case DIVI: 
				R[a] = R[b] / c; 
				break;
			case MOD: case MODI: 
				R[a] = R[b] % c; 
				break;
			case OR:  case ORI:  
				R[a] = R[b] | c; 
				break;
			case AND: case ANDI: 
				R[a] = R[b] & c; 
				break;
			case BIC: case BICI: 
				R[a] = R[b] & (~c); 
				break;
			case XOR: case XORI: 
				R[a] = R[b] ^ c; 
				break;
			case LSH: case LSHI: 
				R[a]=R[b] << c; 
				break;
			case BEQ: 
				if (R[a] == 0) { 
					next = pc + c; 
				} 
				break;
			case BNE: 
				if (R[a] != 0) { 
					next = pc + c; 
				} 
				break;
			case BLT: 
				if (R[a] < 0) { 
					next = pc + c; 
				} 
				break;
			case BGE: 
				if (R[a] >= 0) { 
					next = pc + c; 
				} 
				break;
			case BLE: 
				if (R[a] <= 0) { 
					next = pc + c; 
				} 
				break;
			case BGT: 
				if (R[a] > 0) { 
					next = pc + c; 
				} 
				break;
			case ALL: 
				R[a] = alloc(c/4); 
				break;
			case HSTW: 
				H[(R[b] + c) / 4] = R[a]; 
				break;
			case HLDW: 
				R[a] = H[(R[b] + c) / 4]; 
				break;
			case CHK: case CHKI: 
				check(op,a,b,c,pc); 
				break;
			case SFOPEN: 
				R[a] = getFD((R[b] + c) / 4,0); 
				break;
			case HFOPEN: 
				R[a] = getFD((R[b] + c) / 4,1); 
				break;
			case FCLOSE: 
				fclose(fds[R[c]]); 
				R[a] = 1;
				break;
			case FGETC: 
				R[a] = (int)fgetc(fds[R[c]]); 
				break;
			case FEOF: 
				if (feof(fds[R[c]]) != 0) { 
					R[a]=1;
				} else {
					R[a]=0;
				} 
				break;
			case WRI: 
				printf("%d",R[c]); 
				break;
			case WRC: 
				printf("%c",(char)R[c]); 
				break;
			case RET: 
				next = R[c % 32] / 4; 
				if (next == 6) {
					goto END;
				} 
				break;
			case HLT: 
				fprintf(stderr,"implicit exit with code %d\n", R[c]); 
				getchar();
				exit(-1);
				break;
			case ORD: 
				R[a] = (int)R[c]; 
				break;
		}
		pc = next;
	}
END:
	gettimeofday (Tpf, Tzp);
	fprintf(stderr,"Total VM execution time (usec): %ld\n",
              (Tpf->tv_sec-Tps->tv_sec)*1000000
             + Tpf->tv_usec-Tps->tv_usec);
	fprintf(stderr, "Executed instructions per second: %e\n", counter/(double)(Tpf->tv_sec-Tps->tv_sec));
	return 0;
}